

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_REG_NUM64(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,unsigned_long_long num)

{
  x86Instruction *pxVar1;
  undefined4 uStack_34;
  
  if (op != o_mov64) {
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x4a3,
                  "void EMIT_OP_REG_NUM64(CodeGenGenericContext &, x86Command, x86Reg, unsigned long long)"
                 );
  }
  if (ctx->skipTracking == false) {
    if ((ctx->genReg[reg1].type == argImm64) && (ctx->genReg[reg1].field_1.imm64Arg == num)) {
      ctx->optimizationCount = ctx->optimizationCount + 1;
      return;
    }
    CodeGenGenericContext::OverwriteRegisterWithValue
              (ctx,reg1,(x86Argument)ZEXT1632(CONCAT88(num,CONCAT44(uStack_34,7))));
  }
  pxVar1 = ctx->x86Op;
  pxVar1->name = o_mov64;
  (pxVar1->argA).type = argReg;
  (pxVar1->argA).field_1.reg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argImm64;
  (pxVar1->argB).field_1.imm64Arg = num;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_NUM64(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, unsigned long long num)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_mov64:
		if(ctx.skipTracking)
			break;

		// Skip move if the target already contains the same number
		if(ctx.genReg[reg1].type == x86Argument::argImm64 && ctx.genReg[reg1].imm64Arg == num)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(num));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argImm64;
	ctx.x86Op->argB.imm64Arg = num;
	ctx.x86Op++;
}